

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcMaterialDefinitionRepresentation::~IfcMaterialDefinitionRepresentation
          (IfcMaterialDefinitionRepresentation *this,void **vtt)

{
  void **vtt_local;
  IfcMaterialDefinitionRepresentation *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcMaterialDefinitionRepresentation,_1UL>::
  ~ObjectHelper((ObjectHelper<Assimp::IFC::Schema_2x3::IfcMaterialDefinitionRepresentation,_1UL> *)
                &(this->super_IfcProductRepresentation).field_0x78,vtt + 5);
  IfcProductRepresentation::~IfcProductRepresentation(&this->super_IfcProductRepresentation,vtt + 1)
  ;
  return;
}

Assistant:

IfcMaterialDefinitionRepresentation() : Object("IfcMaterialDefinitionRepresentation") {}